

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationProcessing.hpp
# Opt level: O0

char processOperation(char b,char a,string *op)

{
  code *pcVar1;
  bool bVar2;
  __type _Var3;
  string *op_local;
  char a_local;
  char b_local;
  
  bVar2 = std::operator==(op,"+");
  if (bVar2) {
    op_local._7_1_ = a + b;
  }
  else {
    bVar2 = std::operator==(op,"-");
    if (bVar2) {
      op_local._7_1_ = a - b;
    }
    else {
      bVar2 = std::operator==(op,"*");
      if (bVar2) {
        op_local._7_1_ = a * b;
      }
      else {
        bVar2 = std::operator==(op,"/");
        if (bVar2) {
          op_local._7_1_ = a / b;
        }
        else {
          bVar2 = std::operator==(op,"**");
          if (bVar2) {
            _Var3 = std::pow<char,char>(a,b);
            op_local._7_1_ = (byte)(int)_Var3;
          }
          else {
            bVar2 = std::operator==(op,"%");
            if (bVar2) {
              op_local._7_1_ = a % b;
            }
            else {
              bVar2 = std::operator==(op,"&");
              if (bVar2) {
                op_local._7_1_ = b & a;
              }
              else {
                bVar2 = std::operator==(op,"|");
                if (bVar2) {
                  op_local._7_1_ = b | a;
                }
                else {
                  bVar2 = std::operator==(op,"^");
                  if (bVar2) {
                    op_local._7_1_ = b ^ a;
                  }
                  else {
                    bVar2 = std::operator==(op,">>");
                    if (bVar2) {
                      op_local._7_1_ = (byte)((int)b >> (a & 0x1fU));
                    }
                    else {
                      bVar2 = std::operator==(op,"<<");
                      if (!bVar2) {
                        pcVar1 = (code *)invalidInstructionException();
                        (*pcVar1)();
                      }
                      op_local._7_1_ = (byte)((int)b << (a & 0x1fU));
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return op_local._7_1_;
}

Assistant:

char processOperation(char b, char a, string op) {
	if (op == "+") {
		return a + b;
	}
	if (op == "-") {
		return a - b;
	}
	if (op == "*") {
		return a * b;
	}
	if (op == "/") {
		return a / b;
	}
	if (op == "**") {
		return pow(a, b);
	}
	if (op == "%") {
		return a % b;
	}
	if (op == "&") {
		return b & a;
	}
	if (op == "|") {
		return b | a;
	}
	if (op == "^") {
		return b ^ a;
	}
	if (op == ">>") {
		return b >> a;
	}
	if (op == "<<") {
		return b << a;
	}
}